

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_string_find(jit_State *J,RecordFFData *rd)

{
  undefined2 uVar1;
  TRef TVar2;
  TRef TVar3;
  TRef TVar4;
  TRef TVar5;
  int iVar6;
  GCstr *pGVar7;
  char *pcVar8;
  long in_RSI;
  GCobj *in_RDI;
  TRef pos;
  TRef trp0;
  TRef tr;
  TRef trplen;
  TRef trslen;
  TRef trpptr;
  TRef trsptr;
  int32_t start;
  GCstr *pat;
  GCstr *str;
  TRef trstart;
  TRef tr0;
  TRef trlen;
  TRef trpat;
  TRef trstr;
  TValue *in_stack_fffffffffffffe98;
  GCobj *pGVar9;
  undefined4 in_stack_fffffffffffffea0;
  undefined2 in_stack_fffffffffffffea4;
  undefined2 in_stack_fffffffffffffea6;
  jit_State *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  undefined2 in_stack_fffffffffffffeb4;
  undefined2 in_stack_fffffffffffffeb6;
  undefined2 uVar10;
  GCobj *in_stack_fffffffffffffeb8;
  undefined6 in_stack_fffffffffffffec0;
  undefined2 in_stack_fffffffffffffec6;
  uint local_11c;
  undefined2 local_104;
  
  TVar2 = lj_ir_tostr((jit_State *)
                      CONCAT26(in_stack_fffffffffffffea6,
                               CONCAT24(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0)),
                      (TRef)((ulong)in_stack_fffffffffffffe98 >> 0x20));
  TVar3 = lj_ir_tostr((jit_State *)
                      CONCAT26(in_stack_fffffffffffffea6,
                               CONCAT24(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0)),
                      (TRef)((ulong)in_stack_fffffffffffffe98 >> 0x20));
  *(undefined2 *)((long)in_RDI + 0xa4) = 0x4413;
  *(short *)((long)in_RDI + 0xa0) = (short)TVar2;
  *(undefined2 *)((long)in_RDI + 0xa2) = 0;
  TVar4 = lj_opt_fold(in_stack_fffffffffffffea8);
  uVar10 = (undefined2)TVar4;
  TVar4 = lj_ir_kint((jit_State *)
                     CONCAT26(in_stack_fffffffffffffeb6,
                              CONCAT24(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0)),
                     (int32_t)((ulong)in_stack_fffffffffffffea8 >> 0x20));
  pGVar7 = argv2str((jit_State *)
                    CONCAT26(in_stack_fffffffffffffea6,
                             CONCAT24(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0)),
                    in_stack_fffffffffffffe98);
  argv2str((jit_State *)
           CONCAT26(in_stack_fffffffffffffea6,
                    CONCAT24(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0)),
           in_stack_fffffffffffffe98);
  *(undefined1 *)((long)in_RDI + 0x9d) = 1;
  if ((*(uint *)(*(long *)((long)in_RDI + 0x88) + 8) & 0x1f000000) == 0) {
    lj_ir_kint((jit_State *)
               CONCAT26(in_stack_fffffffffffffeb6,
                        CONCAT24(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0)),
               (int32_t)((ulong)in_stack_fffffffffffffea8 >> 0x20));
    local_11c = 1;
  }
  else {
    lj_opt_narrow_toint((jit_State *)&in_stack_fffffffffffffe98->field_2,0);
    local_11c = argv2int(in_stack_fffffffffffffea8,
                         (TValue *)
                         CONCAT26(in_stack_fffffffffffffea6,
                                  CONCAT24(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0)));
  }
  TVar5 = recff_string_start((jit_State *)
                             CONCAT26(in_stack_fffffffffffffec6,in_stack_fffffffffffffec0),
                             &in_stack_fffffffffffffeb8->str,
                             (int32_t *)
                             CONCAT26(in_stack_fffffffffffffeb6,
                                      CONCAT24(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0))
                             ,(TRef)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                             (TRef)in_stack_fffffffffffffea8,
                             CONCAT22(in_stack_fffffffffffffea6,in_stack_fffffffffffffea4));
  local_104 = (undefined2)TVar5;
  if (pGVar7->len < local_11c) {
    *(undefined2 *)((long)in_RDI + 0xa4) = 0x793;
    *(undefined2 *)((long)in_RDI + 0xa0) = local_104;
    *(undefined2 *)((long)in_RDI + 0xa2) = uVar10;
    lj_opt_fold(in_stack_fffffffffffffea8);
    local_104 = uVar10;
  }
  else {
    *(undefined2 *)((long)in_RDI + 0xa4) = 0x693;
    *(undefined2 *)((long)in_RDI + 0xa0) = local_104;
    *(undefined2 *)((long)in_RDI + 0xa2) = uVar10;
    lj_opt_fold(in_stack_fffffffffffffea8);
  }
  uVar1 = (undefined2)TVar3;
  if ((*(int *)(*(long *)((long)in_RDI + 0x88) + 8) == 0) ||
     ((*(uint *)(*(long *)((long)in_RDI + 0x88) + 0xc) >> 0x18 & 0x1f) < 2)) {
    in_stack_fffffffffffffeb8 = in_RDI;
    in_stack_fffffffffffffec6 = uVar1;
    TVar3 = lj_ir_kgc((jit_State *)CONCAT26(uVar1,in_stack_fffffffffffffec0),in_RDI,
                      CONCAT22(in_stack_fffffffffffffeb6,in_stack_fffffffffffffeb4));
    *(undefined2 *)((long)in_stack_fffffffffffffeb8 + 0xa4) = 0x884;
    *(undefined2 *)((long)in_stack_fffffffffffffeb8 + 0xa0) = in_stack_fffffffffffffec6;
    *(short *)((long)in_stack_fffffffffffffeb8 + 0xa2) = (short)TVar3;
    lj_opt_fold(in_stack_fffffffffffffea8);
    iVar6 = lj_str_haspattern((GCstr *)in_stack_fffffffffffffea8);
    if (iVar6 != 0) {
      recff_nyi((jit_State *)
                CONCAT26(in_stack_fffffffffffffea6,
                         CONCAT24(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0)),
                (RecordFFData *)&in_stack_fffffffffffffe98->field_2);
      return;
    }
  }
  *(undefined2 *)((long)in_RDI + 0xa4) = 0x3f05;
  *(short *)((long)in_RDI + 0xa0) = (short)TVar2;
  *(undefined2 *)((long)in_RDI + 0xa2) = local_104;
  TVar2 = lj_opt_fold(in_stack_fffffffffffffea8);
  *(undefined2 *)((long)in_RDI + 0xa4) = 0x3f05;
  *(undefined2 *)((long)in_RDI + 0xa0) = uVar1;
  *(short *)((long)in_RDI + 0xa2) = (short)TVar4;
  TVar3 = lj_opt_fold(in_stack_fffffffffffffea8);
  *(undefined2 *)((long)in_RDI + 0xa4) = 0x2a13;
  *(undefined2 *)((long)in_RDI + 0xa0) = uVar10;
  *(undefined2 *)((long)in_RDI + 0xa2) = local_104;
  TVar4 = lj_opt_fold(in_stack_fffffffffffffea8);
  *(undefined2 *)((long)in_RDI + 0xa4) = 0x4413;
  *(undefined2 *)((long)in_RDI + 0xa0) = uVar1;
  *(undefined2 *)((long)in_RDI + 0xa2) = 0;
  TVar5 = lj_opt_fold(in_stack_fffffffffffffea8);
  TVar3 = lj_ir_call((jit_State *)&in_RDI->gch,IRCALL_lj_str_find,(ulong)TVar2,(ulong)TVar3,
                     (ulong)TVar4,(ulong)TVar5);
  TVar4 = lj_ir_kptr_((jit_State *)CONCAT26(in_stack_fffffffffffffec6,in_stack_fffffffffffffec0),
                      (IROp)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
                      (void *)CONCAT26(in_stack_fffffffffffffeb6,
                                       CONCAT24(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0)
                                      ));
  pcVar8 = lj_str_find((char *)in_stack_fffffffffffffeb8,
                       (char *)CONCAT26(in_stack_fffffffffffffeb6,
                                        CONCAT24(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0
                                                )),(MSize)((ulong)in_stack_fffffffffffffea8 >> 0x20)
                       ,(MSize)in_stack_fffffffffffffea8);
  uVar10 = (undefined2)TVar3;
  if (pcVar8 == (char *)0x0) {
    *(undefined2 *)((long)in_RDI + 0xa4) = 0x885;
    *(undefined2 *)((long)in_RDI + 0xa0) = uVar10;
    *(short *)((long)in_RDI + 0xa2) = (short)TVar4;
    lj_opt_fold(in_stack_fffffffffffffea8);
    **(undefined4 **)((long)in_RDI + 0x88) = 0x7fff;
  }
  else {
    *(undefined2 *)((long)in_RDI + 0xa4) = 0x985;
    *(undefined2 *)((long)in_RDI + 0xa0) = uVar10;
    *(short *)((long)in_RDI + 0xa2) = (short)TVar4;
    lj_opt_fold(in_stack_fffffffffffffea8);
    *(undefined2 *)((long)in_RDI + 0xa4) = 0x2a13;
    *(undefined2 *)((long)in_RDI + 0xa0) = uVar10;
    *(short *)((long)in_RDI + 0xa2) = (short)TVar2;
    pGVar9 = in_RDI;
    TVar2 = lj_opt_fold(in_stack_fffffffffffffea8);
    *(undefined2 *)((long)pGVar9 + 0xa4) = 0x2913;
    *(undefined2 *)((long)pGVar9 + 0xa0) = local_104;
    *(short *)((long)pGVar9 + 0xa2) = (short)TVar2;
    TVar2 = lj_opt_fold(in_stack_fffffffffffffea8);
    uVar1 = (undefined2)TVar2;
    pGVar9 = in_RDI;
    uVar10 = uVar1;
    TVar2 = lj_ir_kint((jit_State *)
                       CONCAT26(uVar1,CONCAT24(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0))
                       ,(int32_t)((ulong)in_RDI >> 0x20));
    *(undefined2 *)((long)pGVar9 + 0xa4) = 0x2913;
    *(undefined2 *)((long)pGVar9 + 0xa0) = uVar10;
    *(short *)((long)pGVar9 + 0xa2) = (short)TVar2;
    TVar2 = lj_opt_fold((jit_State *)&pGVar9->gch);
    **(TRef **)((long)in_RDI + 0x88) = TVar2;
    *(undefined2 *)((long)in_RDI + 0xa4) = 0x2913;
    *(undefined2 *)((long)in_RDI + 0xa0) = uVar1;
    *(short *)((long)in_RDI + 0xa2) = (short)TVar5;
    TVar2 = lj_opt_fold((jit_State *)&pGVar9->gch);
    *(TRef *)(*(long *)((long)in_RDI + 0x88) + 4) = TVar2;
    *(undefined8 *)(in_RSI + 8) = 2;
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_string_find(jit_State *J, RecordFFData *rd)
{
  TRef trstr = lj_ir_tostr(J, J->base[0]);
  TRef trpat = lj_ir_tostr(J, J->base[1]);
  TRef trlen = emitir(IRTI(IR_FLOAD), trstr, IRFL_STR_LEN);
  TRef tr0 = lj_ir_kint(J, 0);
  TRef trstart;
  GCstr *str = argv2str(J, &rd->argv[0]);
  GCstr *pat = argv2str(J, &rd->argv[1]);
  int32_t start;
  J->needsnap = 1;
  if (tref_isnil(J->base[2])) {
    trstart = lj_ir_kint(J, 1);
    start = 1;
  } else {
    trstart = lj_opt_narrow_toint(J, J->base[2]);
    start = argv2int(J, &rd->argv[2]);
  }
  trstart = recff_string_start(J, str, &start, trstart, trlen, tr0);
  if ((MSize)start <= str->len) {
    emitir(IRTGI(IR_ULE), trstart, trlen);
  } else {
    emitir(IRTGI(IR_UGT), trstart, trlen);
#if LJ_52
    J->base[0] = TREF_NIL;
    return;
#else
    trstart = trlen;
    start = str->len;
#endif
  }
  /* Fixed arg or no pattern matching chars? (Specialized to pattern string.) */
  if ((J->base[2] && tref_istruecond(J->base[3])) ||
      (emitir(IRTG(IR_EQ, IRT_STR), trpat, lj_ir_kstr(J, pat)),
       !lj_str_haspattern(pat))) {  /* Search for fixed string. */
    TRef trsptr = emitir(IRT(IR_STRREF, IRT_PGC), trstr, trstart);
    TRef trpptr = emitir(IRT(IR_STRREF, IRT_PGC), trpat, tr0);
    TRef trslen = emitir(IRTI(IR_SUB), trlen, trstart);
    TRef trplen = emitir(IRTI(IR_FLOAD), trpat, IRFL_STR_LEN);
    TRef tr = lj_ir_call(J, IRCALL_lj_str_find, trsptr, trpptr, trslen, trplen);
    TRef trp0 = lj_ir_kkptr(J, NULL);
    if (lj_str_find(strdata(str)+(MSize)start, strdata(pat),
		    str->len-(MSize)start, pat->len)) {
      TRef pos;
      emitir(IRTG(IR_NE, IRT_PGC), tr, trp0);
      /* Caveat: can't use STRREF trstr 0 here because that might be pointing into a wrong string due to folding. */
      pos = emitir(IRTI(IR_ADD), trstart, emitir(IRTI(IR_SUB), tr, trsptr));
      J->base[0] = emitir(IRTI(IR_ADD), pos, lj_ir_kint(J, 1));
      J->base[1] = emitir(IRTI(IR_ADD), pos, trplen);
      rd->nres = 2;
    } else {
      emitir(IRTG(IR_EQ, IRT_PGC), tr, trp0);
      J->base[0] = TREF_NIL;
    }
  } else {  /* Search for pattern. */
    recff_nyiu(J, rd);
    return;
  }
}